

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_control.c
# Opt level: O0

void CMCondition_destroy(CMControlList cl,int condition)

{
  uint in_ESI;
  long in_RDI;
  CMCondition next;
  CMCondition prev;
  CMCondition cond;
  undefined8 *local_28;
  undefined8 *local_20;
  undefined8 *local_18;
  
  local_18 = (undefined8 *)0x0;
  if (*(long *)(in_RDI + 0xa8) != 0) {
    if (*(uint *)(*(long *)(in_RDI + 0xa8) + 8) == in_ESI) {
      local_18 = *(undefined8 **)(in_RDI + 0xa8);
      *(undefined8 *)(in_RDI + 0xa8) = **(undefined8 **)(in_RDI + 0xa8);
    }
    else {
      local_20 = *(undefined8 **)(in_RDI + 0xa8);
      for (local_28 = (undefined8 *)**(undefined8 **)(in_RDI + 0xa8); local_28 != (undefined8 *)0x0;
          local_28 = (undefined8 *)*local_28) {
        if (*(uint *)(local_28 + 1) == in_ESI) {
          local_18 = local_28;
          *local_20 = *local_28;
          break;
        }
        local_20 = local_28;
      }
    }
  }
  if (local_18 == (undefined8 *)0x0) {
    fprintf(_stderr,"Serious internal error.  Use of condition %d, no longer in control list\n",
            (ulong)in_ESI);
  }
  else {
    pthread_cond_destroy((pthread_cond_t *)(local_18 + 3));
    INT_CMfree((void *)0x129c87);
  }
  return;
}

Assistant:

void
CMCondition_destroy(CMControlList cl, int condition)
{
    CMCondition cond = NULL, prev = NULL;
    CMCondition next = NULL;

    if (cl->condition_list) {
	if (cl->condition_list->condition_num == condition) {
	    cond = cl->condition_list;
	    cl->condition_list = cl->condition_list->next;
	} else {
	    prev = cl->condition_list;
	    next = cl->condition_list->next;
	    while (next != NULL) {
		if (next->condition_num == condition) {
		    cond = next;
		    prev->next = next->next;
		    break;
		}
		prev = next;
		next = next->next;
	    }
	}
    }
    if (cond == NULL) {
	fprintf(stderr, "Serious internal error.  Use of condition %d, no longer in control list\n", condition);
    } else {
	/* free internal elements */
	thr_condition_free(cond->cond_condition);
	INT_CMfree(cond);
    }
}